

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_icu::num_format<char>::do_real_put<unsigned_long>
          (num_format<char> *this,iter_type out,ios_base *ios,char_type fill,unsigned_long val)

{
  formatter<char> fVar1;
  bool bVar2;
  streambuf_type *psVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  iter_type iVar7;
  iter_type iVar8;
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  size_t code_points;
  ostreambuf_iterator<char,_std::char_traits<char>_> local_68;
  long local_58;
  formatter<char> local_50;
  long local_48;
  
  iVar7._M_sbuf = out._M_sbuf;
  local_68._M_failed = out._M_failed;
  local_68._M_sbuf = iVar7._M_sbuf;
  bVar2 = num_base::use_parent<unsigned_long>(ios,val);
  if ((bVar2) ||
     (formatter<char>::create(&local_50,ios,&this->loc_,&this->enc_),
     fVar1.super_base_formatter._vptr_base_formatter =
          local_50.super_base_formatter._vptr_base_formatter,
     local_50.super_base_formatter._vptr_base_formatter == (_func_int **)0x0)) {
    iVar7._8_4_ = out._8_4_ & 0xff;
    iVar7._12_4_ = 0;
    iVar7 = std::num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::
            _M_insert_int<unsigned_long>
                      (&this->
                        super_num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>
                       ,iVar7,ios,fill,val);
    psVar3 = iVar7._M_sbuf;
    uVar4 = iVar7._8_4_;
  }
  else {
    (**(code **)(*(_func_int **)local_50.super_base_formatter._vptr_base_formatter + 0x18))
              (&local_50,local_50.super_base_formatter._vptr_base_formatter,val,&local_58);
    lVar6 = *(long *)(ios + 0x10) - local_58;
    if (lVar6 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar6 = 0;
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar5 = lVar6;
      }
      lVar6 = lVar6 - lVar5;
    }
    for (; 0 < lVar5; lVar5 = lVar5 + -1) {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(&local_68,fill);
    }
    __result._M_failed = local_68._M_failed;
    __result._9_3_ = local_68._9_3_;
    __result._M_sbuf = local_68._M_sbuf;
    __result._12_4_ = 0;
    std::__copy_move_a2<false,char>
              ((char *)local_50.super_base_formatter._vptr_base_formatter,
               (char *)(local_48 + (long)local_50.super_base_formatter._vptr_base_formatter),
               __result);
    for (; psVar3 = local_68._M_sbuf, 0 < lVar6; lVar6 = lVar6 + -1) {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(&local_68,fill);
    }
    *(undefined8 *)(ios + 0x10) = 0;
    uVar4 = CONCAT31(fill >> 7,local_68._M_failed);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(*(_func_int **)fVar1.super_base_formatter._vptr_base_formatter + 8))
              (fVar1.super_base_formatter._vptr_base_formatter);
  }
  iVar8._8_4_ = uVar4;
  iVar8._M_sbuf = psVar3;
  iVar8._12_4_ = 0;
  return iVar8;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }